

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qglxconvenience.cpp
# Opt level: O2

void qglx_surfaceFormatFromVisualInfo
               (QSurfaceFormat *format,Display *display,XVisualInfo *visualInfo,int flags)

{
  long in_FS_OFFSET;
  QColorSpace local_68;
  int srgbCapable;
  int stereo;
  int sampleCount;
  int sampleBuffers;
  int stencilSize;
  int depthSize;
  int alphaSize;
  int blueSize;
  int greenSize;
  int redSize;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  redSize = 0;
  greenSize = 0;
  blueSize = 0;
  alphaSize = 0;
  depthSize = 0;
  stencilSize = 0;
  sampleBuffers = 0;
  sampleCount = 0;
  stereo = 0;
  srgbCapable = 0;
  glXGetConfig(display,visualInfo,8);
  glXGetConfig(display,visualInfo,9,&greenSize);
  glXGetConfig(display,visualInfo,10,&blueSize);
  glXGetConfig(display,visualInfo,0xb,&alphaSize);
  glXGetConfig(display,visualInfo,0xc,&depthSize);
  glXGetConfig(display,visualInfo,0xd,&stencilSize);
  glXGetConfig(display,visualInfo,100000,&sampleBuffers);
  glXGetConfig(display,visualInfo,6,&stereo);
  if ((flags & 1U) != 0) {
    glXGetConfig(display,visualInfo,0x20b2,&srgbCapable);
  }
  QSurfaceFormat::setRedBufferSize(format,redSize);
  QSurfaceFormat::setGreenBufferSize(format,greenSize);
  QSurfaceFormat::setBlueBufferSize(format,blueSize);
  QSurfaceFormat::setAlphaBufferSize(format,alphaSize);
  QSurfaceFormat::setDepthBufferSize(format,depthSize);
  QSurfaceFormat::setStencilBufferSize(format,stencilSize);
  if (sampleBuffers != 0) {
    glXGetConfig(display,visualInfo,0x186a1,&sampleCount);
    QSurfaceFormat::setSamples(format,sampleCount);
  }
  if (srgbCapable == 0) {
    local_68.d_ptr.d.ptr =
         (QExplicitlySharedDataPointer<QColorSpacePrivate>)
         (totally_ordered_wrapper<QColorSpacePrivate_*>)0x0;
  }
  else {
    QColorSpace::QColorSpace(&local_68,SRgb);
  }
  QSurfaceFormat::setColorSpace(format,&local_68);
  QColorSpace::~QColorSpace(&local_68);
  QSurfaceFormat::setStereo(format,stereo != 0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void qglx_surfaceFormatFromVisualInfo(QSurfaceFormat *format, Display *display, XVisualInfo *visualInfo, int flags)
{
    int redSize     = 0;
    int greenSize   = 0;
    int blueSize    = 0;
    int alphaSize   = 0;
    int depthSize   = 0;
    int stencilSize = 0;
    int sampleBuffers = 0;
    int sampleCount = 0;
    int stereo      = 0;
    int srgbCapable = 0;

    glXGetConfig(display, visualInfo, GLX_RED_SIZE,     &redSize);
    glXGetConfig(display, visualInfo, GLX_GREEN_SIZE,   &greenSize);
    glXGetConfig(display, visualInfo, GLX_BLUE_SIZE,    &blueSize);
    glXGetConfig(display, visualInfo, GLX_ALPHA_SIZE,   &alphaSize);
    glXGetConfig(display, visualInfo, GLX_DEPTH_SIZE,   &depthSize);
    glXGetConfig(display, visualInfo, GLX_STENCIL_SIZE, &stencilSize);
    glXGetConfig(display, visualInfo, GLX_SAMPLE_BUFFERS_ARB, &sampleBuffers);
    glXGetConfig(display, visualInfo, GLX_STEREO,       &stereo);
    if (flags & QGLX_SUPPORTS_SRGB)
        glXGetConfig(display, visualInfo, GLX_FRAMEBUFFER_SRGB_CAPABLE_ARB, &srgbCapable);

    format->setRedBufferSize(redSize);
    format->setGreenBufferSize(greenSize);
    format->setBlueBufferSize(blueSize);
    format->setAlphaBufferSize(alphaSize);
    format->setDepthBufferSize(depthSize);
    format->setStencilBufferSize(stencilSize);
    if (sampleBuffers) {
        glXGetConfig(display, visualInfo, GLX_SAMPLES_ARB, &sampleCount);
        format->setSamples(sampleCount);
    }
    if (srgbCapable)
        format->setColorSpace(QColorSpace::SRgb);
    else
        format->setColorSpace(QColorSpace());

    format->setStereo(stereo);
}